

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeLiteGenerator::FindMatchingHeaderfiles
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles)

{
  bool bVar1;
  cmake *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  value_type *__x;
  _Self local_118;
  _Self local_110;
  iterator headerIt;
  string hname;
  string *ext;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_b0;
  char local_89;
  string local_88;
  undefined1 local_68 [8];
  string headerBasename;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
  *sit;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headerExts;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *otherFiles_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  *cFiles_local;
  cmExtraCodeLiteGenerator *this_local;
  
  this_00 = cmGlobalGenerator::GetCMakeInstance
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  this_01 = cmake::GetHeaderExtensions_abi_cxx11_(this_00);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
           ::begin(cFiles);
  sit = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
           ::end(cFiles);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&sit);
    if (!bVar1) {
      return;
    }
    headerBasename.field_2._8_8_ =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
         ::operator*(&__end1);
    cmsys::SystemTools::GetFilenamePath(&local_88,(string *)headerBasename.field_2._8_8_);
    local_89 = '/';
    cmsys::SystemTools::GetFilenameWithoutExtension
              (&local_b0,(string *)headerBasename.field_2._8_8_);
    cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
              ((string *)local_68,&local_88,&local_89,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_88);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    ext = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&ext), bVar1) {
      hname.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      headerIt._M_node._7_1_ = 0x2e;
      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
                ((string *)&stack0xffffffffffffff00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (char *)((long)&headerIt._M_node + 7),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 hname.field_2._8_8_);
      local_110._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(otherFiles,(key_type *)&stack0xffffffffffffff00);
      local_118._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(otherFiles);
      bVar1 = std::operator!=(&local_110,&local_118);
      if (bVar1) {
        bVar1 = true;
      }
      else {
        bVar1 = cmsys::SystemTools::FileExists((string *)&stack0xffffffffffffff00);
        if (bVar1) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                    *)otherFiles,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff00,__x);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)local_68);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmExtraCodeLiteGenerator::FindMatchingHeaderfiles(
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles)
{

  const std::vector<std::string>& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the CodeBlocks
  // project generator.
  for (auto const& sit : cFiles) {
    std::string headerBasename =
      cmStrCat(cmSystemTools::GetFilenamePath(sit.first), '/',
               cmSystemTools::GetFilenameWithoutExtension(sit.first));

    // check if there's a matching header around
    for (std::string const& ext : headerExts) {
      std::string hname = cmStrCat(headerBasename, '.', ext);
      // if it's already in the set, don't check if it exists on disk
      auto headerIt = otherFiles.find(hname);
      if (headerIt != otherFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname)) {
        otherFiles.insert(hname);
        break;
      }
    }
  }
}